

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar16;
  float fVar17;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar14 [32];
  float fVar18;
  undefined1 auVar15 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar35 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar4 * uVar11 * sVar3 + (long)pvVar2);
    lVar9 = 0;
    for (iVar8 = 0; auVar34 = auVar35._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar1 = *pauVar6;
      auVar14._0_8_ = auVar1._0_8_ ^ 0x8000000080000000;
      auVar14._8_4_ = auVar1._8_4_ ^ 0x80000000;
      auVar14._12_4_ = auVar1._12_4_ ^ 0x80000000;
      auVar14._16_4_ = auVar1._16_4_ ^ 0x80000000;
      auVar14._20_4_ = auVar1._20_4_ ^ 0x80000000;
      auVar14._24_4_ = auVar1._24_4_ ^ 0x80000000;
      auVar14._28_4_ = auVar1._28_4_ ^ 0x80000000;
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar27._16_4_ = 0x42b0c0a5;
      auVar27._20_4_ = 0x42b0c0a5;
      auVar27._24_4_ = 0x42b0c0a5;
      auVar27._28_4_ = 0x42b0c0a5;
      auVar14 = vminps_avx(auVar14,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar28._16_4_ = 0xc2b0c0a5;
      auVar28._20_4_ = 0xc2b0c0a5;
      auVar28._24_4_ = 0xc2b0c0a5;
      auVar28._28_4_ = 0xc2b0c0a5;
      auVar27 = vmaxps_avx(auVar14,auVar28);
      auVar29._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
      auVar29._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
      auVar29._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
      auVar29._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
      auVar29._16_4_ = auVar27._16_4_ * 1.442695 + 0.5;
      auVar29._20_4_ = auVar27._20_4_ * 1.442695 + 0.5;
      auVar29._24_4_ = auVar27._24_4_ * 1.442695 + 0.5;
      auVar29._28_4_ = 0x3ff8aa3b;
      auVar15 = vroundps_avx(auVar29,1);
      auVar14 = vcmpps_avx(auVar29,auVar15,1);
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar33._16_4_ = 0x3f800000;
      auVar33._20_4_ = 0x3f800000;
      auVar33._24_4_ = 0x3f800000;
      auVar33._28_4_ = 0x3f800000;
      auVar14 = vandps_avx(auVar14,auVar33);
      auVar14 = vsubps_avx(auVar15,auVar14);
      fVar12 = auVar27._0_4_ + auVar14._0_4_ * -0.6931472;
      fVar16 = auVar27._4_4_ + auVar14._4_4_ * -0.6931472;
      fVar17 = auVar27._8_4_ + auVar14._8_4_ * -0.6931472;
      fVar18 = auVar27._12_4_ + auVar14._12_4_ * -0.6931472;
      fVar19 = auVar27._16_4_ + auVar14._16_4_ * -0.6931472;
      fVar20 = auVar27._20_4_ + auVar14._20_4_ * -0.6931472;
      fVar21 = auVar27._24_4_ + auVar14._24_4_ * -0.6931472;
      auVar22._0_4_ = (int)auVar14._0_4_;
      auVar22._4_4_ = (int)auVar14._4_4_;
      auVar22._8_4_ = (int)auVar14._8_4_;
      auVar22._12_4_ = (int)auVar14._12_4_;
      auVar30._16_4_ = (int)auVar14._16_4_;
      auVar30._0_16_ = auVar22;
      auVar30._20_4_ = (int)auVar14._20_4_;
      auVar30._24_4_ = (int)auVar14._24_4_;
      auVar30._28_4_ = (int)auVar14._28_4_;
      auVar31 = vpslld_avx(auVar22,0x17);
      auVar22 = vpslld_avx(auVar30._16_16_,0x17);
      auVar22 = vpaddd_avx(auVar34,auVar22);
      auVar34 = vpaddd_avx(auVar34,auVar31);
      auVar15._0_4_ =
           (fVar12 + 1.0 +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar34._0_4_ + 1.0;
      auVar15._4_4_ =
           (fVar16 + 1.0 +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar34._4_4_ + 1.0;
      auVar15._8_4_ =
           (fVar17 + 1.0 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar34._8_4_ + 1.0;
      auVar15._12_4_ =
           (fVar18 + 1.0 +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar34._12_4_ + 1.0;
      auVar15._16_4_ =
           (fVar19 + 1.0 +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar22._0_4_ + 1.0;
      auVar15._20_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar22._4_4_ + 1.0;
      auVar15._24_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar22._8_4_ + 1.0;
      auVar15._28_4_ = auVar27._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar1 = vdivps_avx(auVar1,auVar15);
      *pauVar6 = auVar1;
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar22 = *(undefined1 (*) [16])*pauVar6;
      auVar31._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = auVar22._8_4_ ^ 0x80000000;
      auVar31._12_4_ = auVar22._12_4_ ^ 0x80000000;
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar31 = vminps_avx(auVar31,auVar23);
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar23 = vmaxps_avx(auVar31,auVar24);
      auVar25._0_4_ = auVar23._0_4_ * 1.442695 + 0.5;
      auVar25._4_4_ = auVar23._4_4_ * 1.442695 + 0.5;
      auVar25._8_4_ = auVar23._8_4_ * 1.442695 + 0.5;
      auVar25._12_4_ = auVar23._12_4_ * 1.442695 + 0.5;
      auVar32._0_4_ = (int)auVar25._0_4_;
      auVar32._4_4_ = (int)auVar25._4_4_;
      auVar32._8_4_ = (int)auVar25._8_4_;
      auVar32._12_4_ = (int)auVar25._12_4_;
      auVar13 = vcvtdq2ps_avx(auVar32);
      auVar31 = vcmpps_avx(auVar25,auVar13,1);
      auVar31 = vandps_avx(auVar34,auVar31);
      auVar31 = vsubps_avx(auVar13,auVar31);
      fVar12 = auVar23._0_4_ + auVar31._0_4_ * -0.6931472;
      fVar16 = auVar23._4_4_ + auVar31._4_4_ * -0.6931472;
      fVar17 = auVar23._8_4_ + auVar31._8_4_ * -0.6931472;
      fVar18 = auVar23._12_4_ + auVar31._12_4_ * -0.6931472;
      auVar26._0_4_ = (int)auVar31._0_4_;
      auVar26._4_4_ = (int)auVar31._4_4_;
      auVar26._8_4_ = (int)auVar31._8_4_;
      auVar26._12_4_ = (int)auVar31._12_4_;
      auVar31 = vpslld_avx(auVar26,0x17);
      auVar31 = vpaddd_avx(auVar34,auVar31);
      auVar13._0_4_ =
           auVar35._0_4_ +
           (auVar35._0_4_ + fVar12 +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar31._0_4_;
      auVar13._4_4_ =
           auVar35._4_4_ +
           (auVar35._4_4_ + fVar16 +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar31._4_4_;
      auVar13._8_4_ =
           auVar35._8_4_ +
           (auVar35._8_4_ + fVar17 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar31._8_4_;
      auVar13._12_4_ =
           auVar35._12_4_ +
           (auVar35._12_4_ + fVar18 +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar31._12_4_;
      auVar22 = vdivps_avx(auVar22,auVar13);
      *(undefined1 (*) [16])*pauVar6 = auVar22;
      pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar4 * sVar3 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar12 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar5);
      fVar16 = expf(-fVar12);
      auVar35 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar2 + lVar9 * 4 + lVar5) = fVar12 / (fVar16 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}